

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O2

void __thiscall
Atari::ST::ConcreteMachine::set_display_type(ConcreteMachine *this,DisplayType display_type)

{
  _Head_base<0UL,_Atari::ST::Video_*,_false> local_18;
  
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)&stack0xffffffffffffffe0);
  ST::Video::set_display_type(local_18._M_head_impl,display_type);
  std::
  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void set_display_type(Outputs::Display::DisplayType display_type) final {
			video_->set_display_type(display_type);
		}